

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O2

void SetSubMatid(TPZGeoEl *gel,int matid)

{
  int iVar1;
  TPZGeoEl *gel_00;
  int iVar2;
  
  iVar1 = (**(code **)(*(long *)gel + 0x148))();
  iVar2 = 0;
  if (iVar1 < 1) {
    iVar1 = iVar2;
  }
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    gel_00 = (TPZGeoEl *)(**(code **)(*(long *)gel + 0x1f8))(gel,iVar2);
    gel_00->fMatId = matid;
    SetSubMatid(gel_00,matid);
  }
  return;
}

Assistant:

static void SetSubMatid(TPZGeoEl *gel, int matid)
{
    int nsub = gel->NSubElements();
    for (int isub=0; isub < nsub; isub++) {
        TPZGeoEl *subel = gel->SubElement(isub);
        subel->SetMaterialId(matid);
        SetSubMatid(subel, matid);
    }
}